

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,Matrix<double,__1,__1,_0,__1,__1> *lhs,
               Matrix<double,__1,_1,_0,__1,_1> *rhs,Scalar *alpha)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  char *__function;
  long lVar4;
  double dVar5;
  const_blas_data_mapper<double,_long,_1> local_20;
  const_blas_data_mapper<double,_long,_0> local_10;
  
  local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride =
       (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride != 1) {
    local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    local_20.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data =
         (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_20.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride,
          (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols,
          &local_10,&local_20,
          (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,1,
          *alpha);
    return;
  }
  pdVar1 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar2 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar2 < 0 && pdVar1 != (double *)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
    ;
  }
  else {
    pdVar3 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar4 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (-1 < lVar4 || pdVar3 == (double *)0x0) {
      if (lVar2 != lVar4) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, OtherDerived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>]"
                     );
      }
      if (lVar2 == 0) {
        dVar5 = 0.0;
      }
      else {
        if (lVar2 < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        dVar5 = *pdVar1 * *pdVar3;
        if (lVar2 != 1) {
          lVar4 = 1;
          do {
            dVar5 = dVar5 + pdVar1[lVar4] * pdVar3[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar2 != lVar4);
        }
      }
      pdVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      *pdVar1 = *alpha * dVar5 + *pdVar1;
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }